

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lysc_unres_leafref_add(lysc_ctx *ctx,lysc_node_leaf *leaf,lysp_module *param_3)

{
  bool bVar1;
  LY_ERR LVar2;
  undefined8 *object;
  ulong local_60;
  ly_set *local_50;
  ulong uStack_40;
  int is_lref;
  uint64_t u;
  ly_set *leafrefs_set;
  lysc_unres_leafref *l;
  lysp_module *local_mod_local;
  lysc_node_leaf *leaf_local;
  lysc_ctx *ctx_local;
  
  bVar1 = false;
  if ((ctx->compile_opts & 1) != 0) {
    return LY_SUCCESS;
  }
  if ((ctx->compile_opts & 2) == 0) {
    local_50 = &ctx->unres->leafrefs;
  }
  else {
    local_50 = &ctx->unres->disabled_leafrefs;
  }
  if (leaf->type->basetype == LY_TYPE_LEAFREF) {
    bVar1 = true;
  }
  else if (leaf->type->basetype == LY_TYPE_UNION) {
    uStack_40 = 0;
    while( true ) {
      if (leaf->type[1].name == (char *)0x0) {
        local_60 = 0;
      }
      else {
        local_60 = *(ulong *)(leaf->type[1].name + -8);
      }
      if (local_60 <= uStack_40) goto LAB_00178c4c;
      if (*(int *)(*(long *)(leaf->type[1].name + uStack_40 * 8) + 0x18) == 0xe) break;
      uStack_40 = uStack_40 + 1;
    }
    bVar1 = true;
  }
LAB_00178c4c:
  if (bVar1) {
    object = (undefined8 *)calloc(1,0x18);
    if (object == (undefined8 *)0x0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_leafref_add");
      return LY_EMEM;
    }
    *object = leaf;
    object[1] = param_3;
    object[2] = ctx->ext;
    LVar2 = ly_set_add(local_50,object,'\x01',(uint32_t *)0x0);
    if (LVar2 != LY_SUCCESS) {
      free(object);
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_leafref_add");
      return LY_EMEM;
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lysc_unres_leafref_add(struct lysc_ctx *ctx, struct lysc_node_leaf *leaf, const struct lysp_module *local_mod)
{
    struct lysc_unres_leafref *l = NULL;
    struct ly_set *leafrefs_set;
    LY_ARRAY_COUNT_TYPE u;
    int is_lref = 0;

    if (ctx->compile_opts & LYS_COMPILE_GROUPING) {
        /* do not check leafrefs in groupings */
        return LY_SUCCESS;
    }

    /* use special set for disabled leafrefs */
    leafrefs_set = ctx->compile_opts & LYS_COMPILE_DISABLED ? &ctx->unres->disabled_leafrefs : &ctx->unres->leafrefs;

    if (leaf->type->basetype == LY_TYPE_LEAFREF) {
        /* leafref */
        is_lref = 1;
    } else if (leaf->type->basetype == LY_TYPE_UNION) {
        /* union with leafrefs */
        LY_ARRAY_FOR(((struct lysc_type_union *)leaf->type)->types, u) {
            if (((struct lysc_type_union *)leaf->type)->types[u]->basetype == LY_TYPE_LEAFREF) {
                is_lref = 1;
                break;
            }
        }
    }

    if (is_lref) {
        /* add new unresolved leafref node */
        l = calloc(1, sizeof *l);
        LY_CHECK_ERR_RET(!l, LOGMEM(ctx->ctx), LY_EMEM);

        l->node = &leaf->node;
        l->local_mod = local_mod;
        l->ext = ctx->ext;

        LY_CHECK_ERR_RET(ly_set_add(leafrefs_set, l, 1, NULL), free(l); LOGMEM(ctx->ctx), LY_EMEM);
    }

    return LY_SUCCESS;
}